

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte bVar1;
  uint32_t uVar2;
  LogMessage *pLVar3;
  byte *pbVar4;
  pair<bool,_const_unsigned_char_*> pVar5;
  pair<bool,_const_unsigned_char_*> p;
  LogFinisher local_13d;
  uint32_t tag;
  byte local_129;
  LogMessage local_128;
  int local_f0;
  uint local_ec;
  int buf_size;
  uint32_t first_byte_or_zero_local;
  CodedInputStream *this_local;
  bool local_d6;
  bool local_d5;
  int local_d4;
  int local_d0;
  int i;
  uint32_t result;
  uint32_t b;
  uint8_t *ptr;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  int *local_30;
  byte *local_28;
  uint local_1c;
  byte local_18;
  uint8_t *local_10;
  
  local_ec = first_byte_or_zero;
  _buf_size = this;
  local_f0 = BufferSize(this);
  if ((local_f0 < 10) && ((local_f0 < 1 || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    if ((local_f0 == 0) &&
       (((0 < this->buffer_size_after_limit_ || (this->total_bytes_read_ == this->current_limit_))
        && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_))))
    {
      this->legitimate_message_end_ = true;
      return 0;
    }
    uVar2 = ReadTagSlow(this);
    return uVar2;
  }
  local_129 = 0;
  if (local_ec != *this->buffer_) {
    internal::LogMessage::LogMessage
              (&local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x219);
    local_129 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_128,"CHECK failed: (first_byte_or_zero) == (buffer_[0]): ");
    internal::LogFinisher::operator=(&local_13d,pLVar3);
  }
  if ((local_129 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_128);
  }
  if (local_ec == 0) {
    this->buffer_ = this->buffer_ + 1;
    return 0;
  }
  local_28 = this->buffer_;
  local_1c = local_ec;
  local_30 = (int *)((long)&p.second + 4);
  local_69 = 0;
  if (*local_28 != local_ec) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x175);
    local_69 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (*buffer) == (first_byte): ")
    ;
    internal::LogFinisher::operator=(local_7d,pLVar3);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  ptr._7_1_ = 0;
  if ((local_1c & 0x80) != 0x80) {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x176);
    ptr._7_1_ = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_b8,"CHECK failed: (first_byte & 0x80) == (0x80): ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,local_1c);
    internal::LogFinisher::operator=((LogFinisher *)((long)&ptr + 6),pLVar3);
  }
  if ((ptr._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b8);
  }
  _result = local_28 + 2;
  i = (int)local_28[1];
  local_d0 = i * 0x80 + (local_1c - 0x80);
  if ((local_28[1] & 0x80) != 0) {
    bVar1 = *_result;
    i = (int)bVar1;
    local_d0 = i * 0x4000 + local_d0 + -0x4000;
    _result = local_28 + 3;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = local_28[3];
      i = (int)bVar1;
      local_d0 = i * 0x200000 + local_d0 + -0x200000;
      _result = local_28 + 4;
      if ((bVar1 & 0x80) != 0) {
        bVar1 = local_28[4];
        i = (int)bVar1;
        local_d0 = i * 0x10000000 + local_d0 + -0x10000000;
        _result = local_28 + 5;
        if ((bVar1 & 0x80) != 0) {
          for (local_d4 = 0; local_d4 < 5; local_d4 = local_d4 + 1) {
            pbVar4 = _result + 1;
            bVar1 = *_result;
            i = (int)bVar1;
            _result = pbVar4;
            if ((bVar1 & 0x80) == 0) goto LAB_005f449d;
          }
          local_d5 = false;
          pVar5 = std::make_pair<bool,unsigned_char_const*&>(&local_d5,(uchar **)&result);
          local_10 = pVar5.second;
          local_18 = pVar5.first;
          goto LAB_005f44dc;
        }
      }
    }
  }
LAB_005f449d:
  *local_30 = local_d0;
  local_d6 = true;
  pVar5 = std::make_pair<bool,unsigned_char_const*&>(&local_d6,(uchar **)&result);
  local_10 = pVar5.second;
  local_18 = pVar5.first;
LAB_005f44dc:
  if ((local_18 & 1) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this->buffer_ = local_10;
    this_local._4_4_ = p.second._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}